

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

Value * duckdb::DefaultOrderSetting::GetSetting
                  (Value *__return_storage_ptr__,ClientContext *context)

{
  OrderType OVar1;
  DBConfig *pDVar2;
  InternalException *this;
  char *val;
  allocator local_39;
  string local_38;
  
  pDVar2 = DBConfig::GetConfig(context);
  OVar1 = (pDVar2->options).default_order_type;
  if (OVar1 == ASCENDING) {
    val = "asc";
  }
  else {
    if (OVar1 != DESCENDING) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_38,"Unknown order type setting",&local_39);
      InternalException::InternalException(this,&local_38);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    val = "desc";
  }
  Value::Value(__return_storage_ptr__,val);
  return __return_storage_ptr__;
}

Assistant:

Value DefaultOrderSetting::GetSetting(const ClientContext &context) {
	auto &config = DBConfig::GetConfig(context);
	switch (config.options.default_order_type) {
	case OrderType::ASCENDING:
		return "asc";
	case OrderType::DESCENDING:
		return "desc";
	default:
		throw InternalException("Unknown order type setting");
	}
}